

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

size_type __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
CopyListToTree(InnerMap *this,size_type b,Tree *tree)

{
  MapKey *pMVar1;
  MapKey *pMVar2;
  size_type sVar3;
  pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*> local_30;
  
  if ((MapKey *)this->table_[b] == (MapKey *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    pMVar2 = (MapKey *)this->table_[b];
    do {
      local_30.first._M_data = pMVar2;
      local_30.second = pMVar2;
      std::
      _Rb_tree<std::reference_wrapper<google::protobuf::MapKey_const>,std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>,std::_Select1st<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>,std::less<google::protobuf::MapKey>,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>>
      ::
      _M_insert_unique<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>
                ((_Rb_tree<std::reference_wrapper<google::protobuf::MapKey_const>,std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>,std::_Select1st<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>,std::less<google::protobuf::MapKey>,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>>
                  *)tree,&local_30);
      sVar3 = sVar3 + 1;
      pMVar1 = *(MapKey **)((long)&pMVar2[1].val_ + 0x10);
      *(undefined8 *)((long)&pMVar2[1].val_ + 0x10) = 0;
      pMVar2 = pMVar1;
    } while (pMVar1 != (MapKey *)0x0);
  }
  return sVar3;
}

Assistant:

size_type CopyListToTree(size_type b, Tree* tree) {
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      while (node != nullptr) {
        tree->insert({node->kv.first, node});
        ++count;
        Node* next = node->next;
        node->next = nullptr;
        node = next;
      }
      return count;
    }